

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  byte bVar1;
  uint uVar2;
  lbool *plVar3;
  uint *puVar4;
  Watcher WVar5;
  int iVar6;
  Watcher WVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  Watcher *pWVar11;
  uint uVar12;
  Watcher *pWVar13;
  byte bVar14;
  Lit p_00;
  Watcher *pWVar15;
  Watcher *pWVar16;
  Watcher *pWVar17;
  Solver *pSVar18;
  long lVar19;
  Lit p;
  Watcher w;
  uint local_70;
  Lit local_6c;
  Watcher local_68;
  Solver *local_60;
  uint local_54;
  uint local_50;
  int local_4c;
  vec<Minisat::Solver::Watcher,_int> *local_48;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *local_40;
  Watcher *local_38;
  
  iVar6 = this->qhead;
  uVar10 = 0;
  if (iVar6 < (this->trail).sz) {
    local_40 = &this->watches;
    local_70 = 0xffffffff;
    uVar12 = 0;
    local_60 = this;
    do {
      this->qhead = iVar6 + 1;
      local_6c.x = (this->trail).data[iVar6].x;
      local_48 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                 ::lookup(local_40,&local_6c);
      pWVar11 = local_48->data;
      pWVar15 = pWVar11;
      if ((long)local_48->sz == 0) {
        iVar6 = 0;
      }
      else {
        local_38 = pWVar11 + local_48->sz;
        pWVar13 = local_38;
        pWVar16 = pWVar11;
        pSVar18 = this;
        local_54 = uVar12;
        do {
          pWVar11 = local_38;
          this = local_60;
          bVar1 = l_True;
          iVar6 = (pWVar16->blocker).x;
          if ((pSVar18->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
              map.sz <= iVar6 >> 1) goto LAB_0010859a;
          plVar3 = (pSVar18->assigns).
                   super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data;
          bVar14 = l_True & 2;
          if ((((byte)iVar6 & 1 ^ plVar3[iVar6 >> 1].value) != l_True || bVar14 != 0) &&
              (plVar3[iVar6 >> 1].value & bVar14) == 0) {
            uVar12 = pWVar16->cref;
            if ((pSVar18->ca).ra.sz <= uVar12) {
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            puVar4 = (pSVar18->ca).ra.memory;
            uVar8 = local_6c.x ^ 1;
            p_00.x = puVar4[(ulong)uVar12 + 1];
            uVar2 = puVar4[(ulong)uVar12 + 2];
            if (p_00.x == uVar8) {
              puVar4[(ulong)uVar12 + 1] = uVar2;
              puVar4[(ulong)uVar12 + 2] = uVar8;
              p_00.x = uVar2;
            }
            else if (uVar2 != uVar8) {
              __assert_fail("c[1] == false_lit",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                            ,0x211,"CRef Minisat::Solver::propagate()");
            }
            pWVar17 = pWVar16 + 1;
            iVar9 = p_00.x >> 1;
            local_68.cref = uVar12;
            local_68.blocker.x = p_00.x;
            if (p_00.x != iVar6) {
              if ((pSVar18->assigns).
                  super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar9)
              goto LAB_0010859a;
              if (((byte)p_00.x & 1 ^ plVar3[iVar9].value) == bVar1 && bVar14 == 0 ||
                  (bVar14 & plVar3[iVar9].value) != 0) {
                WVar7.blocker.x = p_00.x;
                WVar7.cref = uVar12;
                goto LAB_00108300;
              }
            }
            local_50 = uVar8;
            local_4c = p_00.x;
            if (0x5f < puVar4[uVar12]) {
              lVar19 = 0;
              do {
                uVar2 = puVar4[(ulong)uVar12 + lVar19 + 3];
                if ((local_60->assigns).
                    super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
                    (int)uVar2 >> 1) goto LAB_0010859a;
                if ((((byte)uVar2 & 1 ^ plVar3[(int)uVar2 >> 1].value) != l_False ||
                    (l_False & 2) != 0) && (plVar3[(int)uVar2 >> 1].value & l_False & 2) == 0) {
                  puVar4[(ulong)uVar12 + 2] = uVar2;
                  puVar4[(ulong)uVar12 + lVar19 + 3] = uVar8;
                  if ((local_60->watches).occs.map.sz <=
                      (int)((long)(int)puVar4[(ulong)uVar12 + 2] ^ 1U)) {
                    __assert_fail("has(k)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                                  ,0x28,
                                  "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
                                 );
                  }
                  vec<Minisat::Solver::Watcher,_int>::push
                            ((local_40->occs).map.data + ((long)(int)puVar4[(ulong)uVar12 + 2] ^ 1U)
                             ,&local_68);
                  pWVar11 = local_38;
                  goto LAB_00108308;
                }
                lVar19 = lVar19 + 1;
              } while ((ulong)(puVar4[uVar12] >> 5) - 2 != lVar19);
            }
            WVar5.blocker.x = p_00.x;
            WVar5.cref = uVar12;
            *pWVar15 = WVar5;
            if ((local_60->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                .map.sz <= iVar9) {
LAB_0010859a:
              __assert_fail("has(k)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                            ,0x27,
                            "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                           );
            }
            pWVar15 = pWVar15 + 1;
            bVar1 = (local_60->assigns).
                    super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[iVar9]
                    .value;
            if (((byte)p_00.x & 1 ^ bVar1) == l_False && (l_False & 2) == 0 ||
                (bVar1 & l_False & 2) != 0) {
              local_60->qhead = (local_60->trail).sz;
              for (; local_70 = uVar12, pWVar17 < local_38; pWVar17 = pWVar17 + 1) {
                *pWVar15 = *pWVar17;
                pWVar15 = pWVar15 + 1;
              }
            }
            else {
              uncheckedEnqueue(local_60,p_00,uVar12);
            }
          }
          else {
            WVar7 = *pWVar16;
LAB_00108300:
            pWVar17 = pWVar16 + 1;
            *pWVar15 = WVar7;
            pWVar15 = pWVar15 + 1;
            pWVar11 = pWVar13;
            this = pSVar18;
          }
LAB_00108308:
          pWVar13 = pWVar11;
          pWVar16 = pWVar17;
          pSVar18 = this;
        } while (pWVar17 != pWVar11);
        iVar6 = local_48->sz;
        uVar12 = local_54;
      }
      iVar9 = (int)((ulong)((long)pWVar11 - (long)pWVar15) >> 3);
      if (iVar6 < iVar9) {
        __assert_fail("nelems <= sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                      ,0x41,
                      "void Minisat::vec<Minisat::Solver::Watcher>::shrink(Size) [T = Minisat::Solver::Watcher, _Size = int]"
                     );
      }
      if (0 < iVar9) {
        local_48->sz = iVar6 - iVar9;
      }
      uVar12 = uVar12 + 1;
      iVar6 = this->qhead;
    } while (iVar6 < (this->trail).sz);
    uVar10 = (ulong)uVar12;
  }
  else {
    local_70 = 0xffffffff;
  }
  this->propagations = this->propagations + uVar10;
  this->simpDB_props = this->simpDB_props - uVar10;
  return local_70;
}

Assistant:

CRef Solver::propagate()
{
    CRef    confl     = CRef_Undef;
    int     num_props = 0;

    while (qhead < trail.size()){
        Lit            p   = trail[qhead++];     // 'p' is enqueued fact to propagate.
        vec<Watcher>&  ws  = watches.lookup(p);
        Watcher        *i, *j, *end;
        num_props++;

        for (i = j = (Watcher*)ws, end = i + ws.size();  i != end;){
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True){
                *j++ = *i++; continue; }

            // Make sure the false literal is data[1]:
            CRef     cr        = i->cref;
            Clause&  c         = ca[cr];
            Lit      false_lit = ~p;
            if (c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit     first = c[0];
            Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True){
                *j++ = w; continue; }

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False){
                    c[1] = c[k]; c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause; }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False){
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end)
                    *j++ = *i++;
            }else
                uncheckedEnqueue(first, cr);

        NextClause:;
        }
        ws.shrink(i - j);
    }
    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}